

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

string * __thiscall
fasttext::Args::getAutotuneMetricLabel_abi_cxx11_(string *__return_storage_ptr__,Args *this)

{
  metric_name mVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  mVar1 = getAutotuneMetric(this);
  if (mVar1 == labelf1score) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->autotuneMetric);
    if (__return_storage_ptr__->_M_string_length == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"Empty metric label : ",&this->autotuneMetric);
      std::runtime_error::runtime_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Args::getAutotuneMetricLabel() const {
  if (getAutotuneMetric() == metric_name::labelf1score) {
    std::string label = autotuneMetric.substr(3);
    if (label.empty()) {
      throw std::runtime_error("Empty metric label : " + autotuneMetric);
    }
    return label;
  }
  return std::string();
}